

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

bool __thiscall
Js::FunctionBody::NeedScopeObjectForArguments(FunctionBody *this,bool hasNonSimpleParams)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  undefined4 *puVar4;
  byte local_22;
  byte local_21;
  bool dontNeedScopeObject;
  bool hasNonSimpleParams_local;
  FunctionBody *this_local;
  
  bVar2 = HasReferenceableBuiltInArguments(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xb70,"(HasReferenceableBuiltInArguments())",
                                "HasReferenceableBuiltInArguments()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = ParseableFunctionInfo::GetIsStrictMode(&this->super_ParseableFunctionInfo);
  if ((bVar2) || (local_21 = 0, hasNonSimpleParams)) {
    bVar2 = HasScopeObject(this);
    local_21 = bVar2 ^ 0xff;
  }
  AVar3 = ParseableFunctionInfo::GetInParamsCount(&this->super_ParseableFunctionInfo);
  if (AVar3 < 2) {
    bVar2 = ParseableFunctionInfo::GetHasRestParameter(&this->super_ParseableFunctionInfo);
    local_22 = 0;
    if (!bVar2) goto LAB_00f4d0c4;
  }
  local_22 = local_21 & 1 ^ 0xff;
LAB_00f4d0c4:
  return (bool)(local_22 & 1);
}

Assistant:

bool NeedScopeObjectForArguments(bool hasNonSimpleParams)
        {
            Assert(HasReferenceableBuiltInArguments());
            // We can avoid creating a scope object with arguments present if:
            bool dontNeedScopeObject =
                // Either we are in strict mode, or have strict mode formal semantics from a non-simple parameter list, and
                (GetIsStrictMode() || hasNonSimpleParams)
                // Neither of the scopes are objects
                && !HasScopeObject();

            return
                // Regardless of the conditions above, we won't need a scope object if there aren't any formals.
                (GetInParamsCount() > 1 || GetHasRestParameter())
                && !dontNeedScopeObject;
        }